

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputreader.cpp
# Opt level: O3

void __thiscall InputReader::trimLine(InputReader *this,string *line)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = std::__cxx11::string::find((char *)line,0x148aa6,0);
  if (uVar1 != 0xffffffffffffffff) {
    if (line->_M_string_length < uVar1) goto LAB_00133516;
    line->_M_string_length = uVar1;
    (line->_M_dataplus)._M_p[uVar1] = '\0';
  }
  uVar2 = std::__cxx11::string::find_last_not_of
                    ((char *)line,(ulong)WHITESPACE_abi_cxx11_._M_dataplus._M_p,0xffffffffffffffff);
  if (uVar2 != 0xffffffffffffffff) {
    uVar1 = uVar2 + 1;
    if (line->_M_string_length <= uVar2) {
LAB_00133516:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 uVar1);
    }
    line->_M_string_length = uVar1;
    (line->_M_dataplus)._M_p[uVar1] = '\0';
  }
  return;
}

Assistant:

void InputReader::trimLine(string& line)
{
    // ... skip any characters following a ';'

    size_t pos = line.find(";");
    if (pos != string::npos) line.erase(pos);

    // ... trim any trailing whitespace

    pos = line.find_last_not_of(WHITESPACE);
    if (pos != string::npos) line.erase(pos + 1);
}